

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

void duckdb::IntegralCompressFunction<short,unsigned_int>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  int *piVar2;
  short *psVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  allocate_function_ptr_t p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  data_ptr_t pdVar7;
  ulong uVar8;
  byte bVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  SelectionVector *pSVar12;
  reference pvVar13;
  VectorBuffer *pVVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  idx_t iVar17;
  idx_t iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  idx_t idx_in_entry;
  ulong uVar24;
  optional_idx dict_size;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_90;
  buffer_ptr<VectorBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar13 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  iVar20 = (int)*(short *)pvVar13->data;
  pvVar13 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = pvVar13->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar5 = result->data;
    pdVar7 = pvVar13->data;
    FlatVector::VerifyFlatVector(pvVar13);
    FlatVector::VerifyFlatVector(result);
    puVar4 = (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar4 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar18 = 0;
        do {
          *(int *)(pdVar5 + iVar18 * 4) = *(short *)(pdVar7 + iVar18 * 2) - iVar20;
          iVar18 = iVar18 + 1;
        } while (count != iVar18);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar4 = (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar19 = 0;
        uVar24 = 0;
        do {
          if (puVar4 == (unsigned_long *)0x0) {
            uVar22 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar22 = count;
            }
LAB_00ff33d1:
            uVar21 = uVar24;
            if (uVar24 < uVar22) {
              do {
                *(int *)(pdVar5 + uVar24 * 4) = *(short *)(pdVar7 + uVar24 * 2) - iVar20;
                uVar24 = uVar24 + 1;
                uVar21 = uVar22;
              } while (uVar22 != uVar24);
            }
          }
          else {
            uVar8 = puVar4[uVar19];
            uVar22 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar22 = count;
            }
            uVar21 = uVar22;
            if (uVar8 != 0) {
              if (uVar8 == 0xffffffffffffffff) goto LAB_00ff33d1;
              uVar21 = uVar24;
              if (uVar24 < uVar22) {
                uVar23 = 0;
                do {
                  if ((uVar8 >> (uVar23 & 0x3f) & 1) != 0) {
                    *(int *)(pdVar5 + uVar23 * 4 + uVar24 * 4) =
                         *(short *)(pdVar7 + uVar23 * 2 + uVar24 * 2) - iVar20;
                  }
                  uVar23 = uVar23 + 1;
                  uVar21 = uVar22;
                } while (uVar22 - uVar24 != uVar23);
              }
            }
          }
          uVar19 = uVar19 + 1;
          uVar24 = uVar21;
        } while (uVar19 != count + 0x3f >> 6);
      }
    }
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pvVar13);
      pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar13->buffer);
      local_78.sel = (SelectionVector *)pVVar14[1].data.allocator.ptr;
      if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
         (iVar18 = optional_idx::GetIndex((optional_idx *)&local_78), iVar18 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(pvVar13);
        pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar13->auxiliary);
        if (*(char *)&pVVar14[1]._vptr_VectorBuffer == '\0') {
          local_90 = (Vector *)(pVVar14 + 1);
          pdVar5 = result->data;
          pdVar7 = pVVar14[1].data.pointer;
          local_88 = &pvVar13->buffer;
          iVar18 = optional_idx::GetIndex((optional_idx *)&local_78);
          FlatVector::VerifyFlatVector(local_90);
          FlatVector::VerifyFlatVector(result);
          puVar4 = (unsigned_long *)pVVar14[1].data.allocated_size;
          if (puVar4 == (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              iVar17 = 0;
              do {
                *(int *)(pdVar5 + iVar17 * 4) = *(short *)(pdVar7 + iVar17 * 2) - iVar20;
                iVar17 = iVar17 + 1;
              } while (iVar18 != iVar17);
            }
          }
          else {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                       (pVVar14 + 2));
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (idx_t)pVVar14[2].aux_data.
                        super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
            if (0x3f < iVar18 + 0x3f) {
              iVar17 = pVVar14[1].data.allocated_size;
              uVar19 = 0;
              uVar24 = 0;
              do {
                if (iVar17 == 0) {
                  uVar22 = uVar24 + 0x40;
                  if (iVar18 <= uVar24 + 0x40) {
                    uVar22 = iVar18;
                  }
LAB_00ff3588:
                  uVar21 = uVar24;
                  if (uVar24 < uVar22) {
                    do {
                      *(int *)(pdVar5 + uVar24 * 4) = *(short *)(pdVar7 + uVar24 * 2) - iVar20;
                      uVar24 = uVar24 + 1;
                      uVar21 = uVar22;
                    } while (uVar22 != uVar24);
                  }
                }
                else {
                  uVar8 = *(ulong *)(iVar17 + uVar19 * 8);
                  uVar22 = uVar24 + 0x40;
                  if (iVar18 <= uVar24 + 0x40) {
                    uVar22 = iVar18;
                  }
                  uVar21 = uVar22;
                  if (uVar8 != 0) {
                    if (uVar8 == 0xffffffffffffffff) goto LAB_00ff3588;
                    uVar21 = uVar24;
                    if (uVar24 < uVar22) {
                      uVar23 = 0;
                      do {
                        if ((uVar8 >> (uVar23 & 0x3f) & 1) != 0) {
                          *(int *)(pdVar5 + uVar23 * 4 + uVar24 * 4) =
                               *(short *)(pdVar7 + uVar23 * 2 + uVar24 * 2) - iVar20;
                        }
                        uVar23 = uVar23 + 1;
                        uVar21 = uVar22;
                      } while (uVar22 - uVar24 != uVar23);
                    }
                  }
                }
                uVar19 = uVar19 + 1;
                uVar24 = uVar21;
              } while (uVar19 != iVar18 + 0x3f >> 6);
            }
          }
          DictionaryVector::VerifyDictionary(pvVar13);
          pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(local_88);
          iVar18 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar18,(SelectionVector *)(pVVar14 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar2 = (int *)result->data;
      psVar3 = (short *)pvVar13->data;
      puVar4 = (pvVar13->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *piVar2 = *psVar3 - iVar20;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(pvVar13,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar12 = local_78.sel;
    pdVar5 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        p_Var6 = (allocate_function_ptr_t)pSVar12->sel_vector;
        iVar18 = 0;
        do {
          iVar17 = iVar18;
          if (p_Var6 != (allocate_function_ptr_t)0x0) {
            iVar17 = (idx_t)*(uint *)(p_Var6 + iVar18 * 4);
          }
          *(int *)(pdVar5 + iVar18 * 4) = *(short *)(local_78.data + iVar17 * 2) - iVar20;
          iVar18 = iVar18 + 1;
        } while (count != iVar18);
      }
    }
    else if (count != 0) {
      p_Var6 = (allocate_function_ptr_t)pSVar12->sel_vector;
      uVar24 = 0;
      do {
        uVar19 = uVar24;
        if (p_Var6 != (allocate_function_ptr_t)0x0) {
          uVar19 = (ulong)*(uint *)(p_Var6 + uVar24 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar19 >> 6]
             >> (uVar19 & 0x3f) & 1) == 0) {
          _Var16._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var16._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var11 = p_Stack_a0;
            peVar10 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar10;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var11;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var16._M_head_impl =
                 (pTVar15->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var16._M_head_impl;
          }
          bVar9 = (byte)uVar24 & 0x3f;
          _Var16._M_head_impl[uVar24 >> 6] =
               _Var16._M_head_impl[uVar24 >> 6] &
               (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        }
        else {
          *(int *)(pdVar5 + uVar24 * 4) = *(short *)(local_78.data + uVar19 * 2) - iVar20;
        }
        uVar24 = uVar24 + 1;
      } while (count != uVar24);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}